

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaMan.c
# Opt level: O0

int Pla_ManDist1NumTest(Pla_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  abctime aVar3;
  abctime aVar4;
  int Count;
  abctime clk;
  Pla_Man_t *p_local;
  
  aVar3 = Abc_Clock();
  uVar1 = Pla_ManDist1Num(p);
  uVar2 = Pla_ManCubeNum(p);
  printf("Found %d pairs among %d cubes using cube pair enumeration.  ",(ulong)uVar1,(ulong)uVar2);
  aVar4 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar4 - aVar3);
  return 1;
}

Assistant:

int Pla_ManDist1NumTest( Pla_Man_t * p )
{
    abctime clk = Abc_Clock();
    int Count = Pla_ManDist1Num( p );
    printf( "Found %d pairs among %d cubes using cube pair enumeration.  ", Count, Pla_ManCubeNum(p) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return 1;
}